

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseType(Parser *this,Type *type,string *type_name)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_2 this_00;
  Token *pTVar2;
  pointer ppVar3;
  ErrorMaker local_60;
  iterator local_50;
  undefined1 local_40 [8];
  const_iterator iter;
  TypeNameMap *type_names_table;
  string *type_name_local;
  Type *type_local;
  Parser *this_local;
  
  this_00.slot_ = (slot_type *)anon_unknown_0::GetTypeNameTable();
  iter.inner_.field_1.slot_ = this_00.slot_;
  pTVar2 = io::Tokenizer::current(this->input_);
  _local_40 = (iterator)
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
              ::find<std::__cxx11::string>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                          *)this_00.slot_,&pTVar2->text);
  local_50 = (iterator)
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
                    *)iter.inner_.field_1.slot_);
  bVar1 = absl::lts_20250127::container_internal::operator!=
                    ((const_iterator *)local_40,(const_iterator *)&local_50);
  if (bVar1) {
    bVar1 = std::operator==(&this->syntax_identifier_,"editions");
    if ((bVar1) &&
       (ppVar3 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
                 ::const_iterator::operator->((const_iterator *)local_40),
       ppVar3->second == FieldDescriptorProto_Type_TYPE_GROUP)) {
      ErrorMaker::ErrorMaker
                (&local_60,
                 "Group syntax is no longer supported in editions. To get group behavior you can specify features.message_encoding = DELIMITED on a message field."
                );
      RecordError(this,local_60);
    }
    ppVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
             ::const_iterator::operator->((const_iterator *)local_40);
    *type = ppVar3->second;
    io::Tokenizer::Next(this->input_);
  }
  else {
    bVar1 = ParseUserDefinedType(this,type_name);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Parser::ParseType(FieldDescriptorProto::Type* type,
                       std::string* type_name) {
  const auto& type_names_table = GetTypeNameTable();
  auto iter = type_names_table.find(input_->current().text);
  if (iter != type_names_table.end()) {
    if (syntax_identifier_ == "editions" &&
        iter->second == FieldDescriptorProto::TYPE_GROUP) {
      RecordError(
          "Group syntax is no longer supported in editions. To get group "
          "behavior you can specify features.message_encoding = DELIMITED on a "
          "message field.");
    }
    *type = iter->second;
    input_->Next();
  } else {
    DO(ParseUserDefinedType(type_name));
  }
  return true;
}